

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void white_space(D_Parser *p,d_loc_t *loc,void **p_user_globals)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  ushort *puVar4;
  int iVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  
  pbVar3 = (byte *)loc->s;
  if (*pbVar3 != 0x23) {
    pbVar8 = (byte *)0x0;
    pbVar9 = pbVar3;
    goto LAB_00143641;
  }
  pbVar8 = (byte *)0x0;
  pbVar9 = pbVar3;
  pbVar7 = pbVar3;
  if (loc->col != 0) goto LAB_00143641;
  while( true ) {
    pbVar10 = pbVar7 + 4;
    do {
      pbVar9 = pbVar10;
      uVar11 = (ulong)pbVar9[-3];
      pbVar10 = pbVar9 + 1;
    } while (_wspace[uVar11] != '\0');
    pbVar9 = pbVar9 + -3;
    iVar5 = strncmp("line",(char *)pbVar9,4);
    if (iVar5 == 0) {
      cVar1 = _wspace[*pbVar10];
      while (cVar1 != '\0') {
        uVar11 = (ulong)pbVar10[1];
        pbVar10 = pbVar10 + 1;
        pbVar9 = pbVar10;
        cVar1 = _wspace[uVar11];
      }
    }
    ppuVar6 = __ctype_b_loc();
    puVar4 = *ppuVar6;
    if ((*(byte *)((long)puVar4 + uVar11 * 2 + 1) & 8) == 0) break;
    iVar5 = atoi((char *)pbVar9);
    loc->line = iVar5 + -1;
    pbVar9 = pbVar9 + -2;
    do {
      pbVar7 = pbVar9 + 2;
      pbVar9 = pbVar9 + 1;
    } while ((*(byte *)((long)puVar4 + (ulong)*pbVar7 * 2 + 1) & 8) != 0);
    do {
      pbVar7 = pbVar9 + 1;
      pbVar9 = pbVar9 + 1;
    } while (_wspace[*pbVar7] != '\0');
    if (*pbVar7 == 0x22) {
      loc->pathname = (char *)pbVar9;
    }
    for (; (*pbVar9 != 0 && (*pbVar9 != 10)); pbVar9 = pbVar9 + 1) {
    }
LAB_00143641:
    do {
      while( true ) {
        do {
          pbVar7 = pbVar9;
          bVar2 = *pbVar7;
          pbVar9 = pbVar7 + 1;
        } while (_wspace[bVar2] != '\0');
        if (bVar2 != 0x2f) break;
        bVar2 = *pbVar9;
        if (bVar2 == 0x2f) {
          while ((pbVar9 = pbVar7, bVar2 != 0 && (bVar2 != 10))) {
            pbVar9 = pbVar7 + 1;
            pbVar7 = pbVar7 + 1;
            bVar2 = *pbVar9;
          }
        }
        else {
          if (bVar2 != 0x2a) goto LAB_00143704;
          iVar5 = 0;
LAB_0014369c:
          iVar5 = iVar5 + 1;
          do {
            pbVar9 = pbVar7 + 2;
            do {
              while( true ) {
                while( true ) {
                  pbVar7 = pbVar9;
                  pbVar9 = pbVar7 + 1;
                  bVar2 = *pbVar7;
                  if (0x29 < bVar2) break;
                  if (bVar2 == 10) {
                    loc->line = loc->line + 1;
                    pbVar8 = pbVar9;
                  }
                  else if (bVar2 == 0) goto LAB_00143704;
                }
                if (bVar2 != 0x2f) break;
                if (*pbVar9 == 0x2a) goto LAB_0014369c;
              }
            } while ((bVar2 != 0x2a) || (*pbVar9 != 0x2f));
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          pbVar9 = pbVar7 + 2;
        }
      }
      if (bVar2 != 10) goto LAB_00143704;
      loc->line = loc->line + 1;
      pbVar8 = pbVar9;
      pbVar7 = pbVar9;
    } while (*pbVar9 != 0x23);
  }
LAB_00143704:
  if (pbVar8 == (byte *)0x0) {
    loc->col = loc->col + ((int)pbVar7 - (int)pbVar3);
  }
  else {
    loc->col = (int)pbVar7 - (int)pbVar8;
  }
  loc->s = (char *)pbVar7;
  return;
}

Assistant:

static void white_space(D_Parser *p, d_loc_t *loc, void **p_user_globals) {
  uint rec = 0;
  char *s = loc->s, *scol = 0;
  (void)p;
  (void)p_user_globals;

  if (*s == '#' && loc->col == 0) {
  Ldirective : {
    char *save = s;
    s++;
    while (wspace(*s)) s++;
    if (!strncmp("line", s, 4)) {
      if (wspace(s[4])) {
        s += 5;
        while (wspace(*s)) s++;
      }
    }
    if (isdigit_(*s)) {
      loc->line = atoi(s) - 1;
      while (isdigit_(*s)) s++;
      while (wspace(*s)) s++;
      if (*s == '"') loc->pathname = s;
    } else {
      s = save;
      goto Ldone;
    }
  }
    while (*s && *s != '\n') s++;
  }
Lmore:
  while (wspace(*s)) s++;
  if (*s == '\n') {
    loc->line++;
    scol = s + 1;
    s++;
    if (*s == '#')
      goto Ldirective;
    else
      goto Lmore;
  }
  if (s[0] == '/') {
    if (s[1] == '/') {
      while (*s && *s != '\n') {
        s++;
      }
      goto Lmore;
    }
    if (s[1] == '*') {
      s += 2;
    LnestComment:
      rec++;
    LmoreComment:
      while (*s) {
        if (s[0] == '*' && s[1] == '/') {
          s += 2;
          rec--;
          if (!rec) goto Lmore;
          goto LmoreComment;
        }
        if (s[0] == '/' && s[1] == '*') {
          s += 2;
          goto LnestComment;
        }
        if (*s == '\n') {
          loc->line++;
          scol = s + 1;
        }
        s++;
      }
    }
  }
Ldone:
  if (scol)
    loc->col = s - scol;
  else
    loc->col += s - loc->s;
  loc->s = s;
  return;
}